

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

bool __thiscall
cmComputeLinkInformation::AddLibraryFeature(cmComputeLinkInformation *this,string *feature)

{
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  cmMakefile *pcVar1;
  cmake *pcVar2;
  iterator iVar3;
  bool bVar4;
  pointer ppVar5;
  string *psVar6;
  size_type sVar7;
  reference pvVar8;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_bool>
  pVar9;
  string local_e18;
  string local_df8;
  string local_dd8;
  string local_db8;
  string local_d98;
  LibraryFeatureDescriptor local_d78;
  _Base_ptr local_cd0;
  undefined1 local_cc8;
  string local_cc0;
  string local_ca0;
  string local_c80;
  LibraryFeatureDescriptor local_c60;
  undefined1 local_bb8 [64];
  cmAlphaNum local_b78;
  string local_b48;
  undefined8 local_b28;
  undefined1 local_b20 [16];
  _Base_ptr p_Stack_b10;
  _Base_ptr local_b08;
  _Base_ptr p_Stack_b00;
  size_t local_af8;
  _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  _Stack_af0;
  _Rb_tree_impl<std::less<const_cmSourceFile_*>,_true> _Stack_ac0;
  undefined1 auStack_a90 [40];
  undefined1 local_a68 [64];
  cmAlphaNum local_a28;
  string local_9f8;
  undefined8 local_9d8;
  undefined1 local_9d0 [16];
  _Base_ptr p_Stack_9c0;
  _Base_ptr local_9b8;
  _Base_ptr p_Stack_9b0;
  size_t local_9a8;
  _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  _Stack_9a0;
  undefined1 auStack_970 [32];
  _Base_ptr p_Stack_950;
  size_t local_948;
  _Base_ptr p_Stack_940;
  _Base_ptr local_938;
  _Base_ptr p_Stack_930;
  _Base_ptr local_928;
  undefined1 local_918 [64];
  cmAlphaNum local_8d8;
  string local_8a8;
  undefined8 local_888;
  undefined1 local_880;
  _Base_ptr local_878;
  _Base_ptr p_Stack_870;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_868;
  size_t local_858;
  undefined1 auStack_850 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_840;
  _Base_ptr p_Stack_830;
  size_type local_828;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_820;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_810;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_800;
  _Base_ptr p_Stack_7f0;
  _Base_ptr local_7e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_7e0;
  allocator<char> local_7c1;
  string local_7c0;
  allocator<char> local_799;
  string local_798;
  allocator<char> local_771;
  string local_770;
  allocator<char> local_749;
  string local_748;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_728;
  __normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_720;
  __normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_718;
  const_iterator local_710;
  allocator<char> local_701;
  string local_700;
  allocator<char> local_6d9;
  string local_6d8;
  allocator<char> local_6b1;
  string local_6b0;
  allocator<char> local_689;
  string local_688;
  undefined1 local_668 [64];
  cmAlphaNum local_628;
  string local_5f8;
  undefined8 local_5d8;
  undefined1 local_5d0 [8];
  undefined1 local_5c8 [40];
  _Base_ptr p_Stack_5a0;
  _Base_ptr local_598;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_590;
  _Base_ptr p_Stack_580;
  _Base_ptr local_578;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_570;
  _Base_ptr p_Stack_560;
  __node_base local_558;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_550;
  _Base_ptr p_Stack_540;
  _Base_ptr local_538;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_530;
  undefined1 local_520 [24];
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  items;
  cmAlphaNum local_4e8;
  cmAlphaNum local_4b8;
  string local_488;
  _Base_ptr local_468;
  undefined1 local_460 [8];
  undefined1 local_458 [40];
  _Base_ptr p_Stack_430;
  _Base_ptr local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_400;
  _Base_ptr p_Stack_3f0;
  _Base_ptr local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_3e0;
  __node_base _Stack_3d0;
  _Base_ptr local_3c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_3c0;
  cmValue local_3a8;
  cmValue langFeature;
  undefined1 local_398 [64];
  cmAlphaNum local_358;
  string local_328;
  undefined8 local_308;
  undefined1 local_300;
  _Base_ptr local_2f8;
  _Base_ptr p_Stack_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_2e8;
  _Base_ptr local_2d8;
  _Base_ptr p_Stack_2d0;
  undefined1 local_2c8 [24];
  _Base_ptr p_Stack_2b0;
  _Base_ptr local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_2a0;
  _Base_ptr p_Stack_290;
  _Base_ptr local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_280;
  pointer pAStack_270;
  pointer local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aStack_260;
  cmAlphaNum local_250;
  cmAlphaNum local_220;
  string local_1f0;
  _Base_ptr local_1d0;
  cmAlphaNum local_1c8;
  cmAlphaNum local_198;
  string local_168;
  cmAlphaNum local_148;
  cmAlphaNum local_108;
  string local_d8;
  cmValue local_b8;
  cmValue featureSupported;
  cmAlphaNum local_80;
  undefined1 local_50 [8];
  string featureName;
  _Self local_28;
  iterator it;
  string *feature_local;
  cmComputeLinkInformation *this_local;
  
  it._M_node = (_Base_ptr)feature;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
       ::find(&this->LibraryFeatureDescriptors,feature);
  featureName.field_2._8_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
       ::end(&this->LibraryFeatureDescriptors);
  bVar4 = std::operator!=(&local_28,(_Self *)((long)&featureName.field_2 + 8));
  if (bVar4) {
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>
             ::operator->(&local_28);
    return (bool)((ppVar5->second).Supported & 1);
  }
  cmAlphaNum::cmAlphaNum(&local_80,"CMAKE_");
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)&featureSupported,&this->LinkLanguage);
  cmStrCat<char[21],std::__cxx11::string>
            ((string *)local_50,&local_80,(cmAlphaNum *)&featureSupported,(char (*) [21])0xbedbb5,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)it._M_node);
  pcVar1 = this->Makefile;
  cmAlphaNum::cmAlphaNum(&local_108,(string *)local_50);
  cmAlphaNum::cmAlphaNum(&local_148,"_SUPPORTED");
  cmStrCat<>(&local_d8,&local_108,&local_148);
  local_b8 = cmMakefile::GetDefinition(pcVar1,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  bVar4 = cmValue::operator_cast_to_bool(&local_b8);
  if (!bVar4) {
    cmAlphaNum::cmAlphaNum(&local_198,"CMAKE_LINK_LIBRARY_USING_");
    cmAlphaNum::cmAlphaNum(&local_1c8,(string *)it._M_node);
    cmStrCat<>(&local_168,&local_198,&local_1c8);
    std::__cxx11::string::operator=((string *)local_50,(string *)&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    pcVar1 = this->Makefile;
    cmAlphaNum::cmAlphaNum(&local_220,(string *)local_50);
    cmAlphaNum::cmAlphaNum(&local_250,"_SUPPORTED");
    cmStrCat<>(&local_1f0,&local_220,&local_250);
    local_1d0 = (_Base_ptr)cmMakefile::GetDefinition(pcVar1,&local_1f0);
    local_b8 = (cmValue)local_1d0;
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  bVar4 = cmValue::IsOn(&local_b8);
  iVar3 = it;
  if (!bVar4) {
    local_268 = (pointer)0x0;
    aStack_260._M_allocated_capacity = 0;
    aStack_280._8_8_ = 0;
    pAStack_270 = (pointer)0x0;
    local_288 = (_Base_ptr)0x0;
    aStack_280._M_allocated_capacity = 0;
    aStack_2a0._8_8_ = 0;
    p_Stack_290 = (_Base_ptr)0x0;
    local_2a8 = (_Base_ptr)0x0;
    aStack_2a0._M_allocated_capacity = 0;
    local_2c8._16_8_ = 0;
    p_Stack_2b0 = (_Base_ptr)0x0;
    local_2c8._0_8_ = 0;
    local_2c8._8_8_ = 0;
    local_2d8 = (_Base_ptr)0x0;
    p_Stack_2d0 = (_Base_ptr)0x0;
    local_2e8._M_allocated_capacity = 0;
    local_2e8._8_8_ = 0;
    local_2f8 = (_Base_ptr)0x0;
    p_Stack_2f0 = (_Base_ptr)0x0;
    aStack_260._8_8_ = 0;
    FeatureDescriptor::FeatureDescriptor((FeatureDescriptor *)&local_2f8);
    pVar9 = std::
            map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
            ::emplace<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                      ((map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                        *)&this->LibraryFeatureDescriptors,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       iVar3._M_node,(FeatureDescriptor *)&local_2f8);
    local_308 = pVar9.first._M_node;
    local_300 = pVar9.second;
    FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)&local_2f8);
    pcVar2 = this->CMakeInstance;
    cmAlphaNum::cmAlphaNum(&local_358,"Feature \'");
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)(local_398 + 0x10),(string *)it._M_node);
    psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    cmStrCat<char[77],std::__cxx11::string,char[30],std::__cxx11::string,char[17]>
              (&local_328,&local_358,(cmAlphaNum *)(local_398 + 0x10),
               (char (*) [77])
               "\', specified through generator-expression \'$<LINK_LIBRARY>\' to link target \'",
               psVar6,(char (*) [30])"\', is not supported for the \'",&this->LinkLanguage,
               (char (*) [17])"\' link language.");
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_398);
    cmake::IssueMessage(pcVar2,FATAL_ERROR,&local_328,(cmListFileBacktrace *)local_398);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_398);
    std::__cxx11::string::~string((string *)&local_328);
    this_local._7_1_ = false;
    langFeature.Value._4_4_ = 1;
    goto LAB_004bf5db;
  }
  local_3a8 = cmMakefile::GetDefinition(this->Makefile,(string *)local_50);
  bVar4 = cmValue::operator_cast_to_bool(&local_3a8);
  iVar3 = it;
  if (!bVar4) {
    local_3c8 = (_Base_ptr)0x0;
    aStack_3c0._M_allocated_capacity = 0;
    aStack_3e0._8_8_ = 0;
    _Stack_3d0._M_nxt = (_Hash_node_base *)0x0;
    local_3e8 = (_Base_ptr)0x0;
    aStack_3e0._M_allocated_capacity = 0;
    aStack_400._8_8_ = 0;
    p_Stack_3f0 = (_Base_ptr)0x0;
    aStack_410._8_8_ = (_Base_ptr)0x0;
    aStack_400._M_allocated_capacity = 0;
    aStack_420._8_8_ = 0;
    aStack_410._M_allocated_capacity = 0;
    local_428 = (_Base_ptr)0x0;
    aStack_420._M_allocated_capacity = 0;
    local_458._32_8_ = (_Base_ptr)0x0;
    p_Stack_430 = (_Base_ptr)0x0;
    local_458._16_8_ = 0;
    local_458._24_8_ = 0;
    local_458._0_8_ = (_Base_ptr)0x0;
    local_458._8_8_ = (_Base_ptr)0x0;
    aStack_3c0._8_8_ = 0;
    FeatureDescriptor::FeatureDescriptor((FeatureDescriptor *)local_458);
    pVar9 = std::
            map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
            ::emplace<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                      ((map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                        *)&this->LibraryFeatureDescriptors,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       iVar3._M_node,(FeatureDescriptor *)local_458);
    local_468 = (_Base_ptr)pVar9.first._M_node;
    local_460[0] = pVar9.second;
    FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)local_458);
    pcVar2 = this->CMakeInstance;
    cmAlphaNum::cmAlphaNum(&local_4b8,"Feature \'");
    cmAlphaNum::cmAlphaNum(&local_4e8,(string *)it._M_node);
    psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    cmStrCat<char[77],std::__cxx11::string,char[28],std::__cxx11::string,char[17]>
              (&local_488,&local_4b8,&local_4e8,
               (char (*) [77])
               "\', specified through generator-expression \'$<LINK_LIBRARY>\' to link target \'",
               psVar6,(char (*) [28])"\', is not defined for the \'",&this->LinkLanguage,
               (char (*) [17])"\' link language.");
    cmGeneratorTarget::GetBacktrace
              ((cmGeneratorTarget *)
               &items.
                super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmake::IssueMessage(pcVar2,FATAL_ERROR,&local_488,
                        (cmListFileBacktrace *)
                        &items.
                         super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmListFileBacktrace::~cmListFileBacktrace
              ((cmListFileBacktrace *)
               &items.
                super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_488);
    this_local._7_1_ = false;
    langFeature.Value._4_4_ = 1;
    goto LAB_004bf5db;
  }
  psVar6 = cmValue::operator_cast_to_string_(&local_3a8);
  cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_520);
  cmExpandListWithBacktrace
            ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(local_520 + 0x10),psVar6,(cmListFileBacktrace *)local_520,true);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_520);
  sVar7 = std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::size((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(local_520 + 0x10));
  if (sVar7 == 1) {
    pvVar8 = std::
             vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::front((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)(local_520 + 0x10));
    bVar4 = anon_unknown.dwarf_93c290::IsValidFeatureFormat(&pvVar8->Value);
    if (bVar4) goto LAB_004be156;
LAB_004be19d:
    iVar3._M_node = it._M_node;
    local_538 = (_Base_ptr)0x0;
    aStack_530._M_allocated_capacity = 0;
    aStack_550._8_8_ = 0;
    p_Stack_540 = (_Base_ptr)0x0;
    local_558._M_nxt = (_Hash_node_base *)0x0;
    aStack_550._M_allocated_capacity = 0;
    aStack_570._8_8_ = 0;
    p_Stack_560 = (_Base_ptr)0x0;
    local_578 = (_Base_ptr)0x0;
    aStack_570._M_allocated_capacity = 0;
    aStack_590._8_8_ = 0;
    p_Stack_580 = (_Base_ptr)0x0;
    local_598 = (_Base_ptr)0x0;
    aStack_590._M_allocated_capacity = 0;
    local_5c8._32_8_ = (_Base_ptr)0x0;
    p_Stack_5a0 = (_Base_ptr)0x0;
    local_5c8._16_8_ = 0;
    local_5c8._24_8_ = 0;
    local_5c8._0_8_ = (_Base_ptr)0x0;
    local_5c8._8_8_ = (_Base_ptr)0x0;
    aStack_530._8_8_ = 0;
    FeatureDescriptor::FeatureDescriptor((FeatureDescriptor *)local_5c8);
    pVar9 = std::
            map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
            ::emplace<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                      ((map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                        *)&this->LibraryFeatureDescriptors,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       iVar3._M_node,(FeatureDescriptor *)local_5c8);
    local_5d8 = pVar9.first._M_node;
    local_5d0[0] = pVar9.second;
    FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)local_5c8);
    pcVar2 = this->CMakeInstance;
    cmAlphaNum::cmAlphaNum(&local_628,"Feature \'");
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)(local_668 + 0x10),(string *)it._M_node);
    psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    cmStrCat<char[27],std::__cxx11::string,char[119],std::__cxx11::string,char[3]>
              (&local_5f8,&local_628,(cmAlphaNum *)(local_668 + 0x10),
               (char (*) [27])"\', specified by variable \'",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
               (char (*) [119])
               "\', is malformed (\"<LIBRARY>\", \"<LIB_ITEM>\", or \"<LINK_ITEM>\" patterns are missing) and cannot be used to link target \'"
               ,psVar6,(char (*) [3])0xc0891c);
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_668);
    cmake::IssueMessage(pcVar2,FATAL_ERROR,&local_5f8,(cmListFileBacktrace *)local_668);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_668);
    std::__cxx11::string::~string((string *)&local_5f8);
    this_local._7_1_ = false;
  }
  else {
LAB_004be156:
    sVar7 = std::
            vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::size((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(local_520 + 0x10));
    if (sVar7 == 3) {
      pvVar8 = std::
               vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)(local_520 + 0x10),1);
      bVar4 = anon_unknown.dwarf_93c290::IsValidFeatureFormat(&pvVar8->Value);
      if (!bVar4) goto LAB_004be19d;
    }
    sVar7 = std::
            vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::size((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(local_520 + 0x10));
    if (sVar7 == 1) {
      pvVar8 = std::
               vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::front((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(local_520 + 0x10));
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::push_back((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(local_520 + 0x10),pvVar8);
      pvVar8 = std::
               vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)(local_520 + 0x10),0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_688,"PATH{",&local_689);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b0,"NAME{",&local_6b1);
      anon_unknown.dwarf_93c290::FinalizeFeatureFormat(&pvVar8->Value,&local_688,&local_6b0);
      std::__cxx11::string::~string((string *)&local_6b0);
      std::allocator<char>::~allocator(&local_6b1);
      std::__cxx11::string::~string((string *)&local_688);
      std::allocator<char>::~allocator(&local_689);
      pvVar8 = std::
               vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)(local_520 + 0x10),1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d8,"NAME{",&local_6d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_700,"PATH{",&local_701);
      anon_unknown.dwarf_93c290::FinalizeFeatureFormat(&pvVar8->Value,&local_6d8,&local_700);
      std::__cxx11::string::~string((string *)&local_700);
      std::allocator<char>::~allocator(&local_701);
      std::__cxx11::string::~string((string *)&local_6d8);
      std::allocator<char>::~allocator(&local_6d9);
    }
    else {
      sVar7 = std::
              vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::size((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)(local_520 + 0x10));
      iVar3 = it;
      if (sVar7 != 3) {
        local_7e8 = (_Base_ptr)0x0;
        aStack_7e0._M_allocated_capacity = 0;
        aStack_800._8_8_ = 0;
        p_Stack_7f0 = (_Base_ptr)0x0;
        aStack_810._8_8_ = (_Base_ptr)0x0;
        aStack_800._M_allocated_capacity = 0;
        aStack_820._8_8_ = 0;
        aStack_810._M_allocated_capacity = 0;
        local_828 = 0;
        aStack_820._M_allocated_capacity = 0;
        aStack_840._8_8_ = 0;
        p_Stack_830 = (_Base_ptr)0x0;
        auStack_850._8_8_ = (_Base_ptr)0x0;
        aStack_840._M_allocated_capacity = 0;
        local_858 = 0;
        auStack_850._0_8_ = 0;
        local_868._M_allocated_capacity = 0;
        local_868._8_8_ = 0;
        local_878 = (_Base_ptr)0x0;
        p_Stack_870 = (_Base_ptr)0x0;
        aStack_7e0._8_8_ = 0;
        FeatureDescriptor::FeatureDescriptor((FeatureDescriptor *)&local_878);
        pVar9 = std::
                map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                ::emplace<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                          ((map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                            *)&this->LibraryFeatureDescriptors,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           iVar3._M_node,(FeatureDescriptor *)&local_878);
        local_888 = pVar9.first._M_node;
        local_880 = pVar9.second;
        FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)&local_878);
        pcVar2 = this->CMakeInstance;
        cmAlphaNum::cmAlphaNum(&local_8d8,"Feature \'");
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)(local_918 + 0x10),(string *)it._M_node);
        psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
        cmStrCat<char[27],std::__cxx11::string,char[79],std::__cxx11::string,char[3]>
                  (&local_8a8,&local_8d8,(cmAlphaNum *)(local_918 + 0x10),
                   (char (*) [27])"\', specified by variable \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   (char (*) [79])
                   "\', is malformed (wrong number of elements) and cannot be used to link target \'"
                   ,psVar6,(char (*) [3])0xc0891c);
        cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_918);
        cmake::IssueMessage(pcVar2,FATAL_ERROR,&local_8a8,(cmListFileBacktrace *)local_918);
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_918);
        std::__cxx11::string::~string((string *)&local_8a8);
        this_local._7_1_ = false;
        goto LAB_004bf5bf;
      }
      this_00 = (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(local_520 + 0x10);
      local_720._M_current =
           (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
           std::
           vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(this_00);
      local_718 = __gnu_cxx::
                  __normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::operator+(&local_720,1);
      __gnu_cxx::
      __normal_iterator<BT<std::__cxx11::string>const*,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
      ::__normal_iterator<BT<std::__cxx11::string>*>
                ((__normal_iterator<BT<std::__cxx11::string>const*,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                  *)&local_710,&local_718);
      pvVar8 = std::
               vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,1);
      local_728 = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)std::
                     vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::insert(this_00,local_710,pvVar8);
      pvVar8 = std::
               vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)(local_520 + 0x10),1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_748,"PATH{",&local_749);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_770,"NAME{",&local_771);
      anon_unknown.dwarf_93c290::FinalizeFeatureFormat(&pvVar8->Value,&local_748,&local_770);
      std::__cxx11::string::~string((string *)&local_770);
      std::allocator<char>::~allocator(&local_771);
      std::__cxx11::string::~string((string *)&local_748);
      std::allocator<char>::~allocator(&local_749);
      pvVar8 = std::
               vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)(local_520 + 0x10),2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_798,"NAME{",&local_799);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_7c0,"PATH{",&local_7c1);
      anon_unknown.dwarf_93c290::FinalizeFeatureFormat(&pvVar8->Value,&local_798,&local_7c0);
      std::__cxx11::string::~string((string *)&local_7c0);
      std::allocator<char>::~allocator(&local_7c1);
      std::__cxx11::string::~string((string *)&local_798);
      std::allocator<char>::~allocator(&local_799);
    }
    sVar7 = std::
            vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::size((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(local_520 + 0x10));
    if (sVar7 == 2) {
      pvVar8 = std::
               vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)(local_520 + 0x10),0);
      bVar4 = anon_unknown.dwarf_93c290::IsValidFeatureFormat(&pvVar8->Value);
      if (bVar4) goto LAB_004bec50;
LAB_004bec97:
      iVar3._M_node = it._M_node;
      local_938 = (_Base_ptr)0x0;
      p_Stack_930 = (_Base_ptr)0x0;
      local_948 = 0;
      p_Stack_940 = (_Base_ptr)0x0;
      auStack_970._24_8_ = (_Base_ptr)0x0;
      p_Stack_950 = (_Base_ptr)0x0;
      auStack_970._8_8_ = 0;
      auStack_970._16_8_ = (_Base_ptr)0x0;
      _Stack_9a0.super__Rb_tree_header._M_node_count = 0;
      auStack_970._0_8_ = 0;
      _Stack_9a0.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      _Stack_9a0.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      _Stack_9a0.super__Rb_tree_header._M_header._M_color = _S_red;
      _Stack_9a0.super__Rb_tree_header._M_header._4_4_ = 0;
      _Stack_9a0.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_9a8 = 0;
      _Stack_9a0._0_8_ = 0;
      local_9b8 = (_Base_ptr)0x0;
      p_Stack_9b0 = (_Base_ptr)0x0;
      local_9d0._8_8_ = 0;
      p_Stack_9c0 = (_Base_ptr)0x0;
      local_928 = (_Base_ptr)0x0;
      FeatureDescriptor::FeatureDescriptor((FeatureDescriptor *)(local_9d0 + 8));
      pVar9 = std::
              map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
              ::emplace<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                        ((map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                          *)&this->LibraryFeatureDescriptors,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         iVar3._M_node,(FeatureDescriptor *)(local_9d0 + 8));
      local_9d8 = pVar9.first._M_node;
      local_9d0[0] = pVar9.second;
      FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)(local_9d0 + 8));
      pcVar2 = this->CMakeInstance;
      cmAlphaNum::cmAlphaNum(&local_a28,"Feature \'");
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)(local_a68 + 0x10),(string *)it._M_node);
      psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
      cmStrCat<char[27],std::__cxx11::string,char[144],std::__cxx11::string,char[3]>
                (&local_9f8,&local_a28,(cmAlphaNum *)(local_a68 + 0x10),
                 (char (*) [27])"\', specified by variable \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 (char (*) [144])
                 "\', is malformed (\"<LIBRARY>\", \"<LIB_ITEM>\", or \"<LINK_ITEM>\" patterns are missing for \"PATH{}\" alternative) and cannot be used to link target \'"
                 ,psVar6,(char (*) [3])0xc0891c);
      cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_a68);
      cmake::IssueMessage(pcVar2,FATAL_ERROR,&local_9f8,(cmListFileBacktrace *)local_a68);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_a68);
      std::__cxx11::string::~string((string *)&local_9f8);
      this_local._7_1_ = false;
    }
    else {
LAB_004bec50:
      sVar7 = std::
              vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::size((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)(local_520 + 0x10));
      if (sVar7 == 4) {
        pvVar8 = std::
                 vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)(local_520 + 0x10),1);
        bVar4 = anon_unknown.dwarf_93c290::IsValidFeatureFormat(&pvVar8->Value);
        if (!bVar4) goto LAB_004bec97;
      }
      sVar7 = std::
              vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::size((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)(local_520 + 0x10));
      if (sVar7 == 2) {
        pvVar8 = std::
                 vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)(local_520 + 0x10),1);
        bVar4 = anon_unknown.dwarf_93c290::IsValidFeatureFormat(&pvVar8->Value);
        if (bVar4) goto LAB_004bef1e;
LAB_004bef65:
        iVar3._M_node = it._M_node;
        auStack_a90._8_8_ = 0;
        auStack_a90._16_8_ = (_Base_ptr)0x0;
        _Stack_ac0.super__Rb_tree_header._M_node_count = 0;
        auStack_a90._0_8_ = 0;
        _Stack_ac0.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
        _Stack_ac0.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
        _Stack_ac0.super__Rb_tree_header._M_header._M_color = _S_red;
        _Stack_ac0.super__Rb_tree_header._M_header._4_4_ = 0;
        _Stack_ac0.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        _Stack_af0.super__Rb_tree_header._M_node_count = 0;
        _Stack_ac0._0_8_ = 0;
        _Stack_af0.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
        _Stack_af0.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
        _Stack_af0.super__Rb_tree_header._M_header._M_color = _S_red;
        _Stack_af0.super__Rb_tree_header._M_header._4_4_ = 0;
        _Stack_af0.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_af8 = 0;
        _Stack_af0._0_8_ = 0;
        local_b08 = (_Base_ptr)0x0;
        p_Stack_b00 = (_Base_ptr)0x0;
        local_b20._8_8_ = 0;
        p_Stack_b10 = (_Base_ptr)0x0;
        auStack_a90._24_8_ = (_Base_ptr)0x0;
        FeatureDescriptor::FeatureDescriptor((FeatureDescriptor *)(local_b20 + 8));
        pVar9 = std::
                map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                ::emplace<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                          ((map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                            *)&this->LibraryFeatureDescriptors,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           iVar3._M_node,(FeatureDescriptor *)(local_b20 + 8));
        local_b28 = pVar9.first._M_node;
        local_b20[0] = pVar9.second;
        FeatureDescriptor::~FeatureDescriptor((FeatureDescriptor *)(local_b20 + 8));
        pcVar2 = this->CMakeInstance;
        cmAlphaNum::cmAlphaNum(&local_b78,"Feature \'");
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)(local_bb8 + 0x10),(string *)it._M_node);
        psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
        cmStrCat<char[27],std::__cxx11::string,char[144],std::__cxx11::string,char[3]>
                  (&local_b48,&local_b78,(cmAlphaNum *)(local_bb8 + 0x10),
                   (char (*) [27])"\', specified by variable \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   (char (*) [144])
                   "\', is malformed (\"<LIBRARY>\", \"<LIB_ITEM>\", or \"<LINK_ITEM>\" patterns are missing for \"NAME{}\" alternative) and cannot be used to link target \'"
                   ,psVar6,(char (*) [3])0xc0891c);
        cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_bb8);
        cmake::IssueMessage(pcVar2,FATAL_ERROR,&local_b48,(cmListFileBacktrace *)local_bb8);
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_bb8);
        std::__cxx11::string::~string((string *)&local_b48);
        this_local._7_1_ = false;
      }
      else {
LAB_004bef1e:
        sVar7 = std::
                vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::size((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(local_520 + 0x10));
        if (sVar7 == 4) {
          pvVar8 = std::
                   vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)(local_520 + 0x10),2);
          bVar4 = anon_unknown.dwarf_93c290::IsValidFeatureFormat(&pvVar8->Value);
          if (!bVar4) goto LAB_004bef65;
        }
        cmGeneratorTarget::ResolveLinkerWrapper
                  (this->Target,
                   (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(local_520 + 0x10),&this->LinkLanguage,true);
        sVar7 = std::
                vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::size((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(local_520 + 0x10));
        iVar3 = it;
        if (sVar7 == 2) {
          std::__cxx11::string::string((string *)&local_c80,(string *)it._M_node);
          pvVar8 = std::
                   vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)(local_520 + 0x10),0);
          std::__cxx11::string::string((string *)&local_ca0,(string *)pvVar8);
          pvVar8 = std::
                   vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)(local_520 + 0x10),1);
          std::__cxx11::string::string((string *)&local_cc0,(string *)pvVar8);
          LibraryFeatureDescriptor::LibraryFeatureDescriptor
                    (&local_c60,&local_c80,&local_ca0,&local_cc0);
          pVar9 = std::
                  map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                  ::
                  emplace<std::__cxx11::string_const&,cmComputeLinkInformation::LibraryFeatureDescriptor>
                            ((map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                              *)&this->LibraryFeatureDescriptors,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             iVar3._M_node,&local_c60);
          local_cd0 = (_Base_ptr)pVar9.first._M_node;
          local_cc8 = pVar9.second;
          LibraryFeatureDescriptor::~LibraryFeatureDescriptor(&local_c60);
          std::__cxx11::string::~string((string *)&local_cc0);
          std::__cxx11::string::~string((string *)&local_ca0);
          std::__cxx11::string::~string((string *)&local_c80);
        }
        else {
          std::__cxx11::string::string((string *)&local_d98,(string *)it._M_node);
          pvVar8 = std::
                   vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)(local_520 + 0x10),0);
          std::__cxx11::string::string((string *)&local_db8,(string *)pvVar8);
          pvVar8 = std::
                   vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)(local_520 + 0x10),1);
          std::__cxx11::string::string((string *)&local_dd8,(string *)pvVar8);
          pvVar8 = std::
                   vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)(local_520 + 0x10),2);
          std::__cxx11::string::string((string *)&local_df8,(string *)pvVar8);
          pvVar8 = std::
                   vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)(local_520 + 0x10),3);
          std::__cxx11::string::string((string *)&local_e18,(string *)pvVar8);
          LibraryFeatureDescriptor::LibraryFeatureDescriptor
                    (&local_d78,&local_d98,&local_db8,&local_dd8,&local_df8,&local_e18);
          std::
          map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
          ::emplace<std::__cxx11::string_const&,cmComputeLinkInformation::LibraryFeatureDescriptor>
                    ((map<std::__cxx11::string,cmComputeLinkInformation::FeatureDescriptor,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                      *)&this->LibraryFeatureDescriptors,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     iVar3._M_node,&local_d78);
          LibraryFeatureDescriptor::~LibraryFeatureDescriptor(&local_d78);
          std::__cxx11::string::~string((string *)&local_e18);
          std::__cxx11::string::~string((string *)&local_df8);
          std::__cxx11::string::~string((string *)&local_dd8);
          std::__cxx11::string::~string((string *)&local_db8);
          std::__cxx11::string::~string((string *)&local_d98);
        }
        this_local._7_1_ = true;
      }
    }
  }
LAB_004bf5bf:
  langFeature.Value._4_4_ = 1;
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_520 + 0x10));
LAB_004bf5db:
  std::__cxx11::string::~string((string *)local_50);
  return this_local._7_1_;
}

Assistant:

bool cmComputeLinkInformation::AddLibraryFeature(std::string const& feature)
{
  auto it = this->LibraryFeatureDescriptors.find(feature);
  if (it != this->LibraryFeatureDescriptors.end()) {
    return it->second.Supported;
  }

  auto featureName =
    cmStrCat("CMAKE_", this->LinkLanguage, "_LINK_LIBRARY_USING_", feature);
  cmValue featureSupported =
    this->Makefile->GetDefinition(cmStrCat(featureName, "_SUPPORTED"));
  if (!featureSupported) {
    // language specific variable is not defined, fallback to the more generic
    // one
    featureName = cmStrCat("CMAKE_LINK_LIBRARY_USING_", feature);
    featureSupported =
      this->Makefile->GetDefinition(cmStrCat(featureName, "_SUPPORTED"));
  }
  if (!featureSupported.IsOn()) {
    this->LibraryFeatureDescriptors.emplace(feature, FeatureDescriptor{});

    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(
        "Feature '", feature,
        "', specified through generator-expression '$<LINK_LIBRARY>' to "
        "link target '",
        this->Target->GetName(), "', is not supported for the '",
        this->LinkLanguage, "' link language."),
      this->Target->GetBacktrace());

    return false;
  }

  cmValue langFeature = this->Makefile->GetDefinition(featureName);
  if (!langFeature) {
    this->LibraryFeatureDescriptors.emplace(feature, FeatureDescriptor{});

    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(
        "Feature '", feature,
        "', specified through generator-expression '$<LINK_LIBRARY>' to "
        "link target '",
        this->Target->GetName(), "', is not defined for the '",
        this->LinkLanguage, "' link language."),
      this->Target->GetBacktrace());

    return false;
  }

  auto items =
    cmExpandListWithBacktrace(langFeature, this->Target->GetBacktrace(), true);

  if ((items.size() == 1 && !IsValidFeatureFormat(items.front().Value)) ||
      (items.size() == 3 && !IsValidFeatureFormat(items[1].Value))) {
    this->LibraryFeatureDescriptors.emplace(feature, FeatureDescriptor{});
    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Feature '", feature, "', specified by variable '", featureName,
               "', is malformed (\"<LIBRARY>\", \"<LIB_ITEM>\", or "
               "\"<LINK_ITEM>\" patterns "
               "are missing) and cannot be used to link target '",
               this->Target->GetName(), "'."),
      this->Target->GetBacktrace());

    return false;
  }

  // now, handle possible "PATH{}" and "NAME{}" patterns
  if (items.size() == 1) {
    items.push_back(items.front());
    FinalizeFeatureFormat(items[0].Value, "PATH{", "NAME{");
    FinalizeFeatureFormat(items[1].Value, "NAME{", "PATH{");
  } else if (items.size() == 3) {
    items.insert(items.begin() + 1, items[1]);
    FinalizeFeatureFormat(items[1].Value, "PATH{", "NAME{");
    FinalizeFeatureFormat(items[2].Value, "NAME{", "PATH{");
  } else {
    this->LibraryFeatureDescriptors.emplace(feature, FeatureDescriptor{});
    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Feature '", feature, "', specified by variable '", featureName,
               "', is malformed (wrong number of elements) and cannot be used "
               "to link target '",
               this->Target->GetName(), "'."),
      this->Target->GetBacktrace());

    return false;
  }
  if ((items.size() == 2 && !IsValidFeatureFormat(items[0].Value)) ||
      (items.size() == 4 && !IsValidFeatureFormat(items[1].Value))) {
    // PATH{} has wrong format
    this->LibraryFeatureDescriptors.emplace(feature, FeatureDescriptor{});
    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Feature '", feature, "', specified by variable '", featureName,
               "', is malformed (\"<LIBRARY>\", \"<LIB_ITEM>\", or "
               "\"<LINK_ITEM>\" patterns "
               "are missing for \"PATH{}\" alternative) and cannot be used to "
               "link target '",
               this->Target->GetName(), "'."),
      this->Target->GetBacktrace());

    return false;
  }
  if ((items.size() == 2 && !IsValidFeatureFormat(items[1].Value)) ||
      (items.size() == 4 && !IsValidFeatureFormat(items[2].Value))) {
    // NAME{} has wrong format
    this->LibraryFeatureDescriptors.emplace(feature, FeatureDescriptor{});
    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Feature '", feature, "', specified by variable '", featureName,
               "', is malformed (\"<LIBRARY>\", \"<LIB_ITEM>\", or "
               "\"<LINK_ITEM>\" patterns "
               "are missing for \"NAME{}\" alternative) and cannot be used to "
               "link target '",
               this->Target->GetName(), "'."),
      this->Target->GetBacktrace());

    return false;
  }

  // replace LINKER: pattern
  this->Target->ResolveLinkerWrapper(items, this->LinkLanguage, true);

  if (items.size() == 2) {
    this->LibraryFeatureDescriptors.emplace(
      feature,
      LibraryFeatureDescriptor{ feature, items[0].Value, items[1].Value });
  } else {
    this->LibraryFeatureDescriptors.emplace(
      feature,
      LibraryFeatureDescriptor{ feature, items[0].Value, items[1].Value,
                                items[2].Value, items[3].Value });
  }

  return true;
}